

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O2

void testReadMeta(string *tempdir)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  float dlev;
  int zlev;
  void *udata;
  exr_attribute_t *newattr;
  int partidx;
  string fn;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fn,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,(allocator<char> *)&local_78);
  std::__cxx11::string::append((char *)&fn);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_18 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0x68;
  uStack_20 = 0xbf800000fffffffe;
  local_70 = err_cb;
  iVar1 = exr_test_file_header(fn._M_dataplus._M_p);
  if (iVar1 == 0) {
    iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_78);
    if (iVar1 != 0) goto LAB_0012b726;
    in_RCX = "box2i";
    iVar1 = exr_attr_declare_by_type(f,0,"foo","box2i",&newattr);
    if (iVar1 != 8) goto LAB_0012b787;
    in_RCX = (char *)0x1;
    uVar2 = exr_attr_declare(f,0,"bar",1,&newattr);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 8) goto LAB_0012b827;
    in_RCX = (char *)&partidx;
    uVar2 = exr_add_part(f,"beauty",1);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 8) goto LAB_0012b8c7;
    uVar2 = exr_set_longname_support(f,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 8) goto LAB_0012b967;
    uVar2 = exr_set_longname_support(f,1);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 8) goto LAB_0012ba07;
    udata = (void *)0x3;
    uVar2 = exr_get_user_data(0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 2) goto LAB_0012baa7;
    uVar2 = exr_get_user_data(f,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 3) goto LAB_0012bb47;
    udata = (void *)0x3;
    uVar2 = exr_get_user_data(f);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012bbe7;
    if (udata != (void *)0x0) goto LAB_0012bc48;
    zlev = -2;
    uVar2 = exr_get_zip_compression_level(f,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012bc60;
    iVar1 = 0;
    if (zlev != -1) goto LAB_0012bcc1;
    iVar1 = exr_set_zip_compression_level(f,0,4);
    if (iVar1 != 8) goto LAB_0012bcd9;
    dlev = -3.0;
    uVar2 = exr_get_dwa_compression_level(f,0);
    poVar4 = (ostream *)(ulong)uVar2;
    if (uVar2 != 0) goto LAB_0012bd79;
    iVar1 = 0;
    if ((dlev == 45.0) && (!NAN(dlev))) {
      iVar1 = exr_set_dwa_compression_level(0x42280000,f,0);
      if (iVar1 == 8) {
        exr_finish(&f);
        std::__cxx11::string::~string((string *)&fn);
        return;
      }
      goto LAB_0012bdf2;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_test_file_header (fn.c_str (), &cinit)",(char *)0x81,0x15712d,in_RCX);
LAB_0012b726:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x82,0x15712d,in_RCX);
LAB_0012b787:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_attr_declare_by_type (f, 0, \"foo\", \"box2i\", &newattr)",(char *)0x86,
                   0x15712d,in_RCX);
LAB_0012b827:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_attr_declare (f, 0, \"bar\", EXR_ATTR_BOX2I, &newattr)",(char *)0x89,
                   0x15712d,in_RCX);
LAB_0012b8c7:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_add_part (f, \"beauty\", EXR_STORAGE_TILED, &partidx)",(char *)0x8e,0x15712d
                   ,in_RCX);
LAB_0012b967:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_set_longname_support (f, 0)",(char *)0x91,0x15712d,in_RCX);
LAB_0012ba07:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_set_longname_support (f, 1)",(char *)0x93,0x15712d,in_RCX);
LAB_0012baa7:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_user_data (__null, &udata)",(char *)0x97,0x15712d,in_RCX);
LAB_0012bb47:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_user_data (f, __null)",(char *)0x99,0x15712d,in_RCX);
LAB_0012bbe7:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)poVar4);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_get_user_data (f, &udata)",(char *)0x9b,0x15712d,in_RCX);
LAB_0012bc48:
    core_test_fail("udata == __null",(char *)0x9c,0x15712d,in_RCX);
LAB_0012bc60:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar1 = (int)poVar4;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_zip_compression_level (f, 0, &zlev)",(char *)0x9f,0x15712d,in_RCX);
LAB_0012bcc1:
    core_test_fail("zlev == -1",(char *)0xa0,0x15712d,in_RCX);
LAB_0012bcd9:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(iVar1);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\n    expected: (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(8);
    poVar3 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    core_test_fail("exr_set_zip_compression_level (f, 0, 4)",(char *)0xa2,0x15712d,in_RCX);
LAB_0012bd79:
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar1 = (int)poVar4;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar5 = (char *)exr_get_default_error_message((ulong)poVar4 & 0xffffffff);
    poVar4 = std::operator<<(poVar3,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_get_dwa_compression_level (f, 0, &dlev)",(char *)0xa5,0x15712d,in_RCX);
  }
  core_test_fail("dlev == 45.f",(char *)0xa6,0x15712d,in_RCX);
LAB_0012bdf2:
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar5 = (char *)exr_get_default_error_message(iVar1);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\n    expected: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,8);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar5 = (char *)exr_get_default_error_message(8);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  core_test_fail("exr_set_dwa_compression_level (f, 0, 42.f)",(char *)0xa8,0x15712d,in_RCX);
  std::__cxx11::string::~string((string *)&fn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testReadMeta (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;
    exr_attribute_t*       newattr;
    const exr_attribute_t* attr;

    EXRCORE_TEST_RVAL (exr_test_file_header (fn.c_str (), &cinit));
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_attr_declare_by_type (f, 0, "foo", "box2i", &newattr));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_attr_declare (f, 0, "bar", EXR_ATTR_BOX2I, &newattr));

    int partidx;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE,
        exr_add_part (f, "beauty", EXR_STORAGE_TILED, &partidx));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_longname_support (f, 0));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_longname_support (f, 1));

    void* udata = (void*) 3;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_get_user_data (NULL, &udata));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_get_user_data (f, NULL));
    udata = (void*) 3;
    EXRCORE_TEST_RVAL (exr_get_user_data (f, &udata));
    EXRCORE_TEST (udata == NULL);

    int zlev = -2;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, 0, &zlev));
    EXRCORE_TEST (zlev == -1);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_zip_compression_level (f, 0, 4));

    float dlev = -3.f;
    EXRCORE_TEST_RVAL (exr_get_dwa_compression_level (f, 0, &dlev));
    EXRCORE_TEST (dlev == 45.f);
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_NOT_OPEN_WRITE, exr_set_dwa_compression_level (f, 0, 42.f));

    exr_finish (&f);
}